

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_reference_finite_element.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::ScalarReferenceFiniteElement<double>::NodalValuesToDofs
          (ScalarReferenceFiniteElement<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodvals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  uint uVar4;
  ostream *poVar5;
  DenseStorage<double,__1,_1,__1,_1> *in_RDX;
  Index extraout_RDX;
  Matrix<double,_1,__1,_1,_1,__1> MVar6;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  uVar3 = in_RDX->m_cols;
  uVar4 = (*(code *)(nodvals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                    m_storage.m_data[10])(nodvals);
  if (uVar3 == uVar4) {
    Eigen::DenseStorage<double,_-1,_1,_-1,_1>::DenseStorage
              ((DenseStorage<double,__1,_1,__1,_1> *)this,in_RDX);
    MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         extraout_RDX;
    MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
         (double *)this;
    return (Matrix<double,_1,__1,_1,_1,__1>)
           MVar6.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"nodvals = ",10);
  poVar5 = Eigen::operator<<(local_198,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)in_RDX)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," <-> ",5);
  (*(code *)(nodvals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
            m_data[10])(nodvals);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"nodvals.cols() == NumEvaluationNodes()","");
  paVar2 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/scalar_reference_finite_element.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e8,&local_208,0x13a,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/scalar_reference_finite_element.h"
             ,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  base::AssertionFailed(&local_1e8,&local_208,0x13a,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  abort();
}

Assistant:

[[nodiscard]] virtual Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>
  NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>& nodvals) const {
    LF_ASSERT_MSG(nodvals.cols() == NumEvaluationNodes(),
                  "nodvals = " << nodvals << " <-> " << NumEvaluationNodes());
    return nodvals;
  }